

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# n_pca.cpp
# Opt level: O3

void __thiscall n_pca::NPca::readData(NPca *this,string *data_path)

{
  NConfig *pNVar1;
  long lVar2;
  iterator __position;
  char cVar3;
  int iVar4;
  istream *piVar5;
  long lVar6;
  double *pdVar7;
  pointer pbVar8;
  _Alloc_hider _Var9;
  long lVar10;
  string *this_00;
  long lVar11;
  double *pdVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  vector<double,_std::allocator<double>_> values_vector;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  basic_vector;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  row;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  values;
  string input_str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  ActualDstType actualDst;
  ActualDstType actualDst_1;
  ActualDstType actualDst_2;
  ifstream file;
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  local_308;
  string local_2e8;
  undefined1 local_2c8 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2b0;
  string local_298;
  double local_278;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_270;
  MatrixXd *local_258;
  MatrixXd *local_250;
  MatrixXd *local_248;
  vector<int,_std::allocator<int>_> *local_240;
  long local_238 [65];
  
  if (data_path->_M_string_length == 0) {
    puts("couldn\'t find data_path");
    return;
  }
  std::ifstream::ifstream(local_238,(data_path->_M_dataplus)._M_p,_S_in);
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 == '\0') {
    printf("couldn\'t open data_path: %s\n",(data_path->_M_dataplus)._M_p);
  }
  else {
    local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
    local_298._M_string_length = 0;
    local_298.field_2._M_local_buf[0] = '\0';
    local_258 = &this->basic_matrix_;
    local_250 = &this->train_data_matrix_;
    local_240 = &this->train_label_;
    local_248 = &this->train_mean_;
    while( true ) {
      cVar3 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                              (char)(istream *)local_238);
      piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_238,(string *)&local_298,cVar3);
      if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) break;
      NConfig::n_split(&local_270,this->n_config_,&local_298,':');
      iVar4 = std::__cxx11::string::compare
                        ((char *)local_270.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
      pbVar8 = local_270.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (iVar4 == 0) {
        iVar4 = atoi(local_270.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p);
        this->n_config_->dimension_ = iVar4;
      }
      iVar4 = std::__cxx11::string::compare((char *)pbVar8);
      if (iVar4 == 0) {
        iVar4 = atoi(local_270.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p);
        this->n_config_->image_width_ = iVar4;
      }
      else {
        iVar4 = std::__cxx11::string::compare
                          ((char *)local_270.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
        if (iVar4 == 0) {
          iVar4 = atoi(local_270.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p);
          this->n_config_->image_height_ = iVar4;
        }
        else {
          iVar4 = std::__cxx11::string::compare
                            ((char *)local_270.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
          if (iVar4 == 0) {
            NConfig::n_split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&local_2e8,this->n_config_,&local_298,' ');
            local_2c8._0_8_ = (pointer)0x0;
            local_2c8._8_8_ = (pointer)0x0;
            local_2c8._16_8_ = (pointer)0x0;
            if (local_2e8._M_string_length - (long)local_2e8._M_dataplus._M_p < 0x21) {
              local_308.m_cols.m_value = 0;
            }
            else {
              uVar15 = 1;
              lVar16 = 0x20;
              _Var9._M_p = local_2e8._M_dataplus._M_p;
              do {
                iVar4 = std::__cxx11::string::compare((char *)((long)_Var9._M_p + lVar16));
                _Var9._M_p = local_2e8._M_dataplus._M_p;
                if (iVar4 != 0) {
                  local_308.m_rows.m_value =
                       (long)atof(*(char **)(local_2e8._M_dataplus._M_p + lVar16));
                  if (local_2c8._8_8_ == local_2c8._16_8_) {
                    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                              ((vector<double,_std::allocator<double>_> *)local_2c8,
                               (iterator)local_2c8._8_8_,(double *)&local_308);
                    _Var9._M_p = local_2e8._M_dataplus._M_p;
                  }
                  else {
                    *(long *)local_2c8._8_8_ = local_308.m_rows.m_value;
                    local_2c8._8_8_ = local_2c8._8_8_ + 8;
                  }
                }
                uVar15 = uVar15 + 1;
                lVar16 = lVar16 + 0x20;
              } while (uVar15 < (ulong)((long)(local_2e8._M_string_length - (long)_Var9._M_p) >> 5))
              ;
              local_308.m_cols.m_value = (long)(local_2c8._8_8_ - local_2c8._0_8_) >> 3;
              local_308.m_rows.m_value = 1;
              if (local_308.m_cols.m_value < 0) goto LAB_0010609d;
            }
            local_308.m_functor.m_other = 0.0;
            local_308.m_rows.m_value = 1;
            Eigen::internal::call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                      (local_248,&local_308,(assign_op<double,_double> *)&local_2b0);
            if (local_2c8._8_8_ - local_2c8._0_8_ == 0) {
              if ((pointer)local_2c8._0_8_ != (pointer)0x0) goto LAB_00106016;
            }
            else {
              lVar6 = (long)(local_2c8._8_8_ - local_2c8._0_8_) >> 3;
              pdVar7 = (this->train_mean_).
                       super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                       m_data;
              lVar16 = (this->train_mean_).
                       super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                       m_rows;
              lVar10 = 0;
              do {
                *pdVar7 = *(double *)(local_2c8._0_8_ + lVar10 * 8);
                lVar10 = lVar10 + 1;
                pdVar7 = pdVar7 + lVar16;
              } while (lVar6 + (ulong)(lVar6 == 0) != lVar10);
LAB_00106016:
              operator_delete((void *)local_2c8._0_8_);
            }
            this_00 = &local_2e8;
          }
          else {
            iVar4 = std::__cxx11::string::compare
                              ((char *)local_270.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start);
            if (iVar4 == 0) {
              NConfig::n_split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&local_2e8,this->n_config_,&local_298,' ');
              if ((pointer)local_2e8._M_string_length != local_2e8._M_dataplus._M_p) {
                lVar16 = 0;
                uVar15 = 0;
                _Var9._M_p = local_2e8._M_dataplus._M_p;
                do {
                  iVar4 = std::__cxx11::string::compare((char *)((long)_Var9._M_p + lVar16));
                  _Var9._M_p = local_2e8._M_dataplus._M_p;
                  if (iVar4 != 0) {
                    iVar4 = atoi(*(char **)(local_2e8._M_dataplus._M_p + lVar16));
                    local_2c8._0_4_ = iVar4;
                    __position._M_current =
                         (this->train_label_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
                    if (__position._M_current ==
                        (this->train_label_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
                      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                                (local_240,__position,(int *)local_2c8);
                      _Var9._M_p = local_2e8._M_dataplus._M_p;
                    }
                    else {
                      *__position._M_current = iVar4;
                      (this->train_label_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish = __position._M_current + 1;
                    }
                  }
                  uVar15 = uVar15 + 1;
                  lVar16 = lVar16 + 0x20;
                } while (uVar15 < (ulong)((long)(local_2e8._M_string_length - (long)_Var9._M_p) >> 5
                                         ));
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&local_2e8);
              goto LAB_00106025;
            }
            iVar4 = std::__cxx11::string::compare
                              ((char *)local_270.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start);
            if (iVar4 == 0) {
              pNVar1 = this->n_config_;
              std::__cxx11::string::string
                        ((string *)&local_2e8,
                         local_270.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p,
                         (allocator *)&local_308);
              NConfig::n_split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_2c8,pNVar1,&local_2e8,',');
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
                operator_delete(local_2e8._M_dataplus._M_p);
              }
              local_2e8._M_dataplus._M_p = (pointer)0x0;
              local_2e8._M_string_length = 0;
              local_2e8.field_2._M_allocated_capacity = 0;
              uVar15 = 0;
              do {
                local_308.m_rows.m_value = 0;
                local_308.m_cols.m_value = 0;
                local_308.m_functor.m_other = 0.0;
                NConfig::n_split(&local_2b0,this->n_config_,
                                 (string *)(local_2c8._0_8_ + uVar15 * 0x20),' ');
                if (local_2b0.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish !=
                    local_2b0.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) {
                  lVar16 = 0;
                  uVar14 = 0;
                  pbVar8 = local_2b0.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  do {
                    iVar4 = std::__cxx11::string::compare
                                      ((char *)((long)&(pbVar8->_M_dataplus)._M_p + lVar16));
                    pbVar8 = local_2b0.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                    if (iVar4 != 0) {
                      local_278 = atof(*(char **)((long)local_2b0.
                                                                                                                
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + lVar16
                                                 ));
                      if ((double)local_308.m_cols.m_value == local_308.m_functor.m_other) {
                        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                                  ((vector<double,_std::allocator<double>_> *)&local_308,
                                   (iterator)local_308.m_cols.m_value,&local_278);
                        pbVar8 = local_2b0.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start;
                      }
                      else {
                        *(double *)local_308.m_cols.m_value = local_278;
                        local_308.m_cols.m_value = local_308.m_cols.m_value + 8;
                      }
                    }
                    uVar14 = uVar14 + 1;
                    lVar16 = lVar16 + 0x20;
                  } while (uVar14 < (ulong)((long)local_2b0.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)pbVar8 >> 5));
                }
                if (local_308.m_cols.m_value != local_308.m_rows.m_value) {
                  std::
                  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ::push_back((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)&local_2e8,(value_type *)&local_308);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_2b0);
                if ((double *)local_308.m_rows.m_value != (double *)0x0) {
                  operator_delete((void *)local_308.m_rows.m_value);
                }
                uVar15 = uVar15 + 1;
              } while (uVar15 < (ulong)((long)(local_2c8._8_8_ - local_2c8._0_8_) >> 5));
              local_308.m_rows.m_value =
                   ((long)(local_2e8._M_string_length - (long)local_2e8._M_dataplus._M_p) >> 3) *
                   -0x5555555555555555;
              local_308.m_cols.m_value =
                   *(long *)(local_2e8._M_dataplus._M_p + 8) - *(long *)local_2e8._M_dataplus._M_p
                   >> 3;
              local_308.m_functor.m_other = 0.0;
              if ((local_308.m_cols.m_value | local_308.m_rows.m_value) < 0) {
LAB_0010609d:
                local_308.m_functor.m_other = 0.0;
                __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                              ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                              "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1>]"
                             );
              }
              Eigen::internal::call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                        (local_250,&local_308,(assign_op<double,_double> *)&local_2b0);
              if (local_2e8._M_string_length - (long)local_2e8._M_dataplus._M_p != 0) {
                lVar6 = ((long)(local_2e8._M_string_length - (long)local_2e8._M_dataplus._M_p) >> 3)
                        * -0x5555555555555555;
                pdVar7 = (this->train_data_matrix_).
                         super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                         m_data;
                lVar16 = (this->train_data_matrix_).
                         super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                         m_rows;
                lVar10 = 0;
                do {
                  lVar2 = *(long *)(local_2e8._M_dataplus._M_p + lVar10 * 0x18);
                  lVar11 = *(long *)(local_2e8._M_dataplus._M_p + lVar10 * 0x18 + 8) - lVar2;
                  if (lVar11 != 0) {
                    lVar11 = lVar11 >> 3;
                    lVar13 = 0;
                    pdVar12 = pdVar7;
                    do {
                      *pdVar12 = *(double *)(lVar2 + lVar13 * 8);
                      lVar13 = lVar13 + 1;
                      pdVar12 = pdVar12 + lVar16;
                    } while (lVar11 + (ulong)(lVar11 == 0) != lVar13);
                  }
                  lVar10 = lVar10 + 1;
                  pdVar7 = pdVar7 + 1;
                } while (lVar10 != lVar6 + (ulong)(lVar6 == 0));
              }
            }
            else {
              iVar4 = std::__cxx11::string::compare
                                ((char *)local_270.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start);
              if (iVar4 != 0) goto LAB_00106025;
              pNVar1 = this->n_config_;
              std::__cxx11::string::string
                        ((string *)&local_2e8,
                         local_270.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p,
                         (allocator *)&local_308);
              NConfig::n_split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_2c8,pNVar1,&local_2e8,',');
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
                operator_delete(local_2e8._M_dataplus._M_p);
              }
              local_2e8._M_dataplus._M_p = (pointer)0x0;
              local_2e8._M_string_length = 0;
              local_2e8.field_2._M_allocated_capacity = 0;
              uVar15 = 0;
              do {
                local_308.m_rows.m_value = 0;
                local_308.m_cols.m_value = 0;
                local_308.m_functor.m_other = 0.0;
                NConfig::n_split(&local_2b0,this->n_config_,
                                 (string *)(local_2c8._0_8_ + uVar15 * 0x20),' ');
                if (local_2b0.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish !=
                    local_2b0.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) {
                  lVar16 = 0;
                  uVar14 = 0;
                  pbVar8 = local_2b0.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  do {
                    iVar4 = std::__cxx11::string::compare
                                      ((char *)((long)&(pbVar8->_M_dataplus)._M_p + lVar16));
                    pbVar8 = local_2b0.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                    if (iVar4 != 0) {
                      local_278 = atof(*(char **)((long)local_2b0.
                                                                                                                
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + lVar16
                                                 ));
                      if ((double)local_308.m_cols.m_value == local_308.m_functor.m_other) {
                        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                                  ((vector<double,_std::allocator<double>_> *)&local_308,
                                   (iterator)local_308.m_cols.m_value,&local_278);
                        pbVar8 = local_2b0.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start;
                      }
                      else {
                        *(double *)local_308.m_cols.m_value = local_278;
                        local_308.m_cols.m_value = local_308.m_cols.m_value + 8;
                      }
                    }
                    uVar14 = uVar14 + 1;
                    lVar16 = lVar16 + 0x20;
                  } while (uVar14 < (ulong)((long)local_2b0.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)pbVar8 >> 5));
                }
                if (local_308.m_cols.m_value != local_308.m_rows.m_value) {
                  std::
                  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ::push_back((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)&local_2e8,(value_type *)&local_308);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_2b0);
                if ((double *)local_308.m_rows.m_value != (double *)0x0) {
                  operator_delete((void *)local_308.m_rows.m_value);
                }
                uVar15 = uVar15 + 1;
              } while (uVar15 < (ulong)((long)(local_2c8._8_8_ - local_2c8._0_8_) >> 5));
              local_308.m_rows.m_value =
                   ((long)(local_2e8._M_string_length - (long)local_2e8._M_dataplus._M_p) >> 3) *
                   -0x5555555555555555;
              local_308.m_cols.m_value =
                   *(long *)(local_2e8._M_dataplus._M_p + 8) - *(long *)local_2e8._M_dataplus._M_p
                   >> 3;
              local_308.m_functor.m_other = 0.0;
              if ((local_308.m_cols.m_value | local_308.m_rows.m_value) < 0) goto LAB_0010609d;
              Eigen::internal::call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                        (local_258,&local_308,(assign_op<double,_double> *)&local_2b0);
              if (local_2e8._M_string_length - (long)local_2e8._M_dataplus._M_p != 0) {
                lVar6 = ((long)(local_2e8._M_string_length - (long)local_2e8._M_dataplus._M_p) >> 3)
                        * -0x5555555555555555;
                pdVar7 = (this->basic_matrix_).
                         super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                         m_data;
                lVar16 = (this->basic_matrix_).
                         super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                         m_rows;
                lVar10 = 0;
                do {
                  lVar2 = *(long *)(local_2e8._M_dataplus._M_p + lVar10 * 0x18);
                  lVar11 = *(long *)(local_2e8._M_dataplus._M_p + lVar10 * 0x18 + 8) - lVar2;
                  if (lVar11 != 0) {
                    lVar11 = lVar11 >> 3;
                    lVar13 = 0;
                    pdVar12 = pdVar7;
                    do {
                      *pdVar12 = *(double *)(lVar2 + lVar13 * 8);
                      lVar13 = lVar13 + 1;
                      pdVar12 = pdVar12 + lVar16;
                    } while (lVar11 + (ulong)(lVar11 == 0) != lVar13);
                  }
                  lVar10 = lVar10 + 1;
                  pdVar7 = pdVar7 + 1;
                } while (lVar10 != lVar6 + (ulong)(lVar6 == 0));
              }
            }
            std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       *)&local_2e8);
            this_00 = (string *)local_2c8;
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)this_00);
        }
      }
LAB_00106025:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_270);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != &local_298.field_2) {
      operator_delete(local_298._M_dataplus._M_p);
    }
  }
  std::ifstream::~ifstream(local_238);
  return;
}

Assistant:

void NPca::readData(const string data_path)
{
    if (data_path.length() <= 0)
    {
        printf("couldn't find data_path\n");
        return;
    }

    ifstream file(data_path.c_str());

    if (!file.is_open())
    {
        printf("couldn't open data_path: %s\n", data_path.c_str());
        return;
    }

    string input_str;
    while(getline(file, input_str))
    {
        vector<string> tokens = n_config_->n_split(input_str, ':');

        // set value
        if (tokens[0] == "dimension")
        {
            n_config_->dimension_ = atoi(tokens[1].c_str());
        }
        if (tokens[0] == "image_width")
        {
            n_config_->image_width_ = atoi(tokens[1].c_str());
        }
        else if (tokens[0] == "image_height")
        {
            n_config_->image_height_ = atoi(tokens[1].c_str());
        }
        else if (tokens[0] == "train_mean")
        {
            vector<string> values = n_config_->n_split(input_str, ' ');
            vector<double> mean_vector;
            for (int i = 1; i < values.size(); i++)
            {
                if (values[i] == "")
                {
                    continue;
                }
                mean_vector.push_back(atof(values[i].c_str()));
            }

            train_mean_ = MatrixXd::Zero(1, mean_vector.size());

            for (int i = 0; i < mean_vector.size(); i++)
                train_mean_.coeffRef(0, i) = mean_vector[i];
        }
        else if (tokens[0] == "train_label")
        {
            vector<string> values = n_config_->n_split(input_str, ' ');
            for (int i = 0; i < values.size(); i++)
            {
                if (values[i] == "")
                    continue;

                train_label_.push_back(atoi(values[i].c_str()));
            }
        }
        else if (tokens[0] == "train_data_matrix")
        {
            vector<string> row = n_config_->n_split(tokens[1].c_str(), ',');
            vector<vector<double> > train_data_vector;
            for (int i = 0; i < row.size(); i++)
            {
                vector<double> values_vector;
                vector<string> values = n_config_->n_split(row[i], ' ');
                for (int j = 0; j < values.size(); j++)
                {
                    if (values[j] == "")
                    {
                        continue;
                    }
                    values_vector.push_back(atof(values[j].c_str()));
                }
                if (values_vector.size() > 0)
                    train_data_vector.push_back(values_vector);
            }

            train_data_matrix_ = MatrixXd::Zero(train_data_vector.size(), train_data_vector[0].size());

            for (int i = 0; i < train_data_vector.size(); i++)
            {
                for (int j = 0; j < train_data_vector[i].size(); j++)
                {
                    train_data_matrix_.coeffRef(i, j) = train_data_vector[i][j];
                }
            }
        }
        else if (tokens[0] == "basic_matrix")
        {
            vector<string> row = n_config_->n_split(tokens[1].c_str(), ',');
            vector<vector<double> > basic_vector;
            for (int i = 0; i < row.size(); i++)
            {
                vector<double> values_vector;
                vector<string> values = n_config_->n_split(row[i], ' ');
                for (int j = 0; j < values.size(); j++)
                {
                    if (values[j] == "")
                    {
                        continue;
                    }
                    values_vector.push_back(atof(values[j].c_str()));  
                }
                if (values_vector.size() > 0)
                    basic_vector.push_back(values_vector);
            }

            basic_matrix_ = MatrixXd::Zero(basic_vector.size(), basic_vector[0].size());

            for (int i = 0; i < basic_vector.size(); i++)
            {
                for (int j = 0; j < basic_vector[i].size(); j++)
                {
                    basic_matrix_.coeffRef(i, j) = basic_vector[i][j];
                }
            }
        }
    }

}